

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

int64_t __thiscall
icu_63::CollationBuilder::getSpecialResetPosition
          (CollationBuilder *this,UnicodeString *str,char **parserErrorReason,UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  int64_t *piVar3;
  uint *puVar4;
  byte bVar5;
  uint uVar6;
  int32_t index;
  uint32_t uVar7;
  char *pcVar8;
  uint32_t *puVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  char16_t *pcVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar10 = (str->fUnion).fFields.fLength;
  }
  else {
    uVar10 = (int)sVar1 >> 5;
  }
  if (uVar10 < 2) {
    return 0;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar14 = (str->fUnion).fFields.fArray;
  }
  else {
    pcVar14 = (char16_t *)((long)&str->fUnion + 2);
  }
  cVar2 = pcVar14[1];
  uVar10 = 0;
  bVar5 = 1;
  switch(cVar2) {
  case L'⠂':
    uVar10 = findOrInsertNodeForRootCE(this,0,2,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return 0;
    }
    iVar11 = (this->nodes).count;
    if ((int)uVar10 < iVar11 && -1 < (int)uVar10) {
      piVar3 = (this->nodes).elements;
      uVar10 = *(uint *)(piVar3 + uVar10) >> 8;
      uVar6 = uVar10 & 0xfffff;
      if (((int)uVar6 < iVar11 && uVar6 != 0) && ((*(uint *)(piVar3 + uVar6) & 0xb) == 10)) {
        return ((ulong)((uVar10 & 0x3f) << 0x18) |
               (ulong)(uVar10 & 0x1fc0) << 0x2a | (ulong)(uVar10 & 0xfe000) << 0x2b) +
               0x4040000006002200;
      }
    }
    puVar4 = (this->rootElements).elements;
    return (ulong)(puVar4[*puVar4] & 0xffffff7f);
  case L'⠃':
    puVar9 = (this->rootElements).elements;
    uVar6 = puVar9[puVar9[1] - 1];
    uVar10 = 2;
    goto LAB_0022d7bb;
  case L'⠄':
    uVar10 = findOrInsertNodeForRootCE(this,0,1,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return 0;
    }
    uVar6 = (this->nodes).count;
    piVar3 = (this->nodes).elements;
    if ((int)uVar10 < (int)uVar6 && -1 < (int)uVar10) {
      uVar17 = piVar3[uVar10];
    }
    else {
      uVar17 = 0;
    }
    do {
      uVar10 = (uint)(uVar17 >> 8) & 0xfffff;
      if (((uVar17 >> 8 & 0xfffff) == 0) || ((int)uVar6 <= (int)uVar10)) goto LAB_0022d7a3;
      uVar17 = piVar3[uVar10];
      if ((uVar17 & 3) == 0) goto LAB_0022d7a3;
    } while (((uint)uVar17 & 3) != 1);
    if ((uVar17 & 8) != 0) {
      if ((uVar17 & 0x20) != 0) {
        uVar12 = (uint)uVar17 >> 8 & 0xfffff;
        uVar10 = 0;
        if (uVar12 < uVar6) {
          uVar10 = *(uint *)(piVar3 + uVar12) >> 8;
        }
      }
      return ((ulong)((uVar10 & 0x3f) << 0x18) |
             (ulong)(uVar10 & 0x1fc0) << 0x2a | (ulong)(uVar10 & 0xfe000) << 0x2b) +
             0x4040000006002100;
    }
LAB_0022d7a3:
    puVar9 = (this->rootElements).elements;
    uVar10 = puVar9[1];
    goto LAB_0022d7aa;
  case L'⠅':
    puVar9 = (this->rootElements).elements;
    uVar10 = puVar9[2] - 1;
LAB_0022d7aa:
    uVar6 = puVar9[uVar10];
    uVar10 = 1;
LAB_0022d7bb:
    uVar17 = (ulong)(uVar6 & 0xffffff7f);
    bVar5 = 0;
    break;
  case L'⠆':
    puVar9 = (this->rootElements).elements;
    uVar17 = (ulong)puVar9[puVar9[2]] << 0x20 | 0x5000500;
    break;
  case L'⠇':
    uVar17 = CollationRootElements::lastCEWithPrimaryBefore
                       (&this->rootElements,this->variableTop + 1);
    goto LAB_0022d758;
  case L'⠈':
    uVar17 = CollationRootElements::firstCEWithPrimaryAtLeast
                       (&this->rootElements,this->variableTop + 1);
    break;
  case L'⠉':
    uVar7 = CollationData::getFirstPrimaryForGroup(this->baseData,0x11);
    uVar17 = CollationRootElements::firstCEWithPrimaryAtLeast(&this->rootElements,uVar7);
    goto LAB_0022d758;
  case L'⠊':
    uVar17 = CollationData::getSingleCE(this->baseData,0x4e00,errorCode);
LAB_0022d758:
    bVar5 = 0;
    uVar10 = 0;
    break;
  case L'⠋':
    *errorCode = U_UNSUPPORTED_ERROR;
    pcVar8 = "reset to [last implicit] not supported";
    goto LAB_0022d672;
  case L'⠌':
    uVar17 = 0xff02020005000500;
    uVar10 = 0;
    break;
  case L'⠍':
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    pcVar8 = "LDML forbids tailoring to U+FFFF";
LAB_0022d672:
    *parserErrorReason = pcVar8;
    return 0;
  default:
    return 0;
  }
  uVar6 = findOrInsertNodeForRootCE(this,uVar17,uVar10,errorCode);
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar11 = (this->nodes).count;
  if ((int)uVar6 < iVar11 && -1 < (int)uVar6) {
    uVar13 = (this->nodes).elements[uVar6];
  }
  else {
    uVar13 = 0;
  }
  if ((cVar2 & 1U) == 0) {
    if (!(bool)(bVar5 ^ 1 | (uVar13 & 0x60) != 0)) {
      uVar12 = (uint)uVar13 >> 8;
      uVar6 = uVar12 & 0xfffff;
      if (uVar6 == 0) {
        uVar7 = (uint32_t)(uVar17 >> 0x20);
        index = CollationRootElements::findPrimary(&this->rootElements,uVar7);
        uVar7 = CollationRootElements::getPrimaryAfter
                          (&this->rootElements,uVar7,index,
                           this->baseData->compressibleBytes[uVar17 >> 0x38]);
        if (U_ZERO_ERROR < *errorCode) {
          return 0;
        }
        uVar6 = findOrInsertNodeForPrimary(this,uVar7,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return 0;
        }
        uVar17 = (ulong)uVar7 << 0x20 | 0x5000500;
        iVar11 = (this->nodes).count;
        if (iVar11 <= (int)uVar6 || (int)uVar6 < 0) {
          return uVar17;
        }
        uVar13 = (this->nodes).elements[uVar6];
      }
      else {
        if ((int)uVar6 < iVar11) {
          uVar13 = (this->nodes).elements[uVar6];
        }
        else {
          uVar13 = 0;
        }
        uVar17 = ((ulong)(uVar10 << 8) | 0x4040000006002000) + ((ulong)(uVar12 & 0xfe000) << 0x2b) +
                 (ulong)((uVar12 & 0x3f) << 0x18) + ((ulong)(uVar12 & 0x1fc0) << 0x2a);
      }
    }
    if ((uVar13 & 0x60) == 0) {
      return uVar17;
    }
    if ((uVar13 & 0x40) != 0) {
      uVar12 = (uint)(uVar13 >> 8) & 0xfffff;
      uVar6 = 0;
      if ((int)uVar12 < iVar11) {
        uVar6 = *(uint *)((this->nodes).elements + uVar12) >> 8 & 0xfffff;
      }
      if (iVar11 <= (int)uVar6) goto LAB_0022d9e8;
      uVar13 = (this->nodes).elements[uVar6];
    }
    if ((uVar13 & 0x20) != 0) {
      uVar12 = (uint)(uVar13 >> 8) & 0xfffff;
      uVar6 = 0;
      if ((int)uVar12 < iVar11) {
        uVar6 = *(uint *)((this->nodes).elements + uVar12) >> 8;
      }
    }
  }
  else {
    uVar12 = (uint)(uVar13 >> 8);
    if ((uVar13 & 0xfffff00) != 0) {
      do {
        uVar15 = uVar12 & 0xfffff;
        if ((int)uVar15 < iVar11) {
          uVar16 = (this->nodes).elements[uVar15];
        }
        else {
          uVar16 = 0;
        }
      } while ((uVar10 <= ((uint)uVar16 & 3)) &&
              (uVar12 = (uint)(uVar16 >> 8), uVar13 = uVar16, uVar6 = uVar15,
              (uVar16 & 0xfffff00) != 0));
    }
    if ((uVar13 & 8) == 0) {
      return uVar17;
    }
  }
LAB_0022d9e8:
  return ((ulong)(uVar10 << 8) | 0x4040000006002000) + ((ulong)(uVar6 & 0xfe000) << 0x2b) +
         (ulong)((uVar6 & 0x3f) << 0x18) + ((ulong)(uVar6 & 0x1fc0) << 0x2a);
}

Assistant:

int64_t
CollationBuilder::getSpecialResetPosition(const UnicodeString &str,
                                          const char *&parserErrorReason, UErrorCode &errorCode) {
    U_ASSERT(str.length() == 2);
    int64_t ce;
    int32_t strength = UCOL_PRIMARY;
    UBool isBoundary = FALSE;
    UChar32 pos = str.charAt(1) - CollationRuleParser::POS_BASE;
    U_ASSERT(0 <= pos && pos <= CollationRuleParser::LAST_TRAILING);
    switch(pos) {
    case CollationRuleParser::FIRST_TERTIARY_IGNORABLE:
        // Quaternary CEs are not supported.
        // Non-zero quaternary weights are possible only on tertiary or stronger CEs.
        return 0;
    case CollationRuleParser::LAST_TERTIARY_IGNORABLE:
        return 0;
    case CollationRuleParser::FIRST_SECONDARY_IGNORABLE: {
        // Look for a tailored tertiary node after [0, 0, 0].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_TERTIARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        if((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            U_ASSERT(strengthFromNode(node) <= UCOL_TERTIARY);
            if(isTailoredNode(node) && strengthFromNode(node) == UCOL_TERTIARY) {
                return tempCEFromIndexAndStrength(index, UCOL_TERTIARY);
            }
        }
        return rootElements.getFirstTertiaryCE();
        // No need to look for nodeHasAnyBefore() on a tertiary node.
    }
    case CollationRuleParser::LAST_SECONDARY_IGNORABLE:
        ce = rootElements.getLastTertiaryCE();
        strength = UCOL_TERTIARY;
        break;
    case CollationRuleParser::FIRST_PRIMARY_IGNORABLE: {
        // Look for a tailored secondary node after [0, 0, *].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_SECONDARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        while((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            strength = strengthFromNode(node);
            if(strength < UCOL_SECONDARY) { break; }
            if(strength == UCOL_SECONDARY) {
                if(isTailoredNode(node)) {
                    if(nodeHasBefore3(node)) {
                        index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                        U_ASSERT(isTailoredNode(nodes.elementAti(index)));
                    }
                    return tempCEFromIndexAndStrength(index, UCOL_SECONDARY);
                } else {
                    break;
                }
            }
        }
        ce = rootElements.getFirstSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    }
    case CollationRuleParser::LAST_PRIMARY_IGNORABLE:
        ce = rootElements.getLastSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    case CollationRuleParser::FIRST_VARIABLE:
        ce = rootElements.getFirstPrimaryCE();
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 00A0, SPACE first primary
        break;
    case CollationRuleParser::LAST_VARIABLE:
        ce = rootElements.lastCEWithPrimaryBefore(variableTop + 1);
        break;
    case CollationRuleParser::FIRST_REGULAR:
        ce = rootElements.firstCEWithPrimaryAtLeast(variableTop + 1);
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 263A, SYMBOL first primary
        break;
    case CollationRuleParser::LAST_REGULAR:
        // Use the Hani-first-primary rather than the actual last "regular" CE before it,
        // for backward compatibility with behavior before the introduction of
        // script-first-primary CEs in the root collator.
        ce = rootElements.firstCEWithPrimaryAtLeast(
            baseData->getFirstPrimaryForGroup(USCRIPT_HAN));
        break;
    case CollationRuleParser::FIRST_IMPLICIT:
        ce = baseData->getSingleCE(0x4e00, errorCode);
        break;
    case CollationRuleParser::LAST_IMPLICIT:
        // We do not support tailoring to an unassigned-implicit CE.
        errorCode = U_UNSUPPORTED_ERROR;
        parserErrorReason = "reset to [last implicit] not supported";
        return 0;
    case CollationRuleParser::FIRST_TRAILING:
        ce = Collation::makeCE(Collation::FIRST_TRAILING_PRIMARY);
        isBoundary = TRUE;  // trailing first primary (there is no mapping for it)
        break;
    case CollationRuleParser::LAST_TRAILING:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        parserErrorReason = "LDML forbids tailoring to U+FFFF";
        return 0;
    default:
        U_ASSERT(FALSE);
        return 0;
    }

    int32_t index = findOrInsertNodeForRootCE(ce, strength, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    int64_t node = nodes.elementAti(index);
    if((pos & 1) == 0) {
        // even pos = [first xyz]
        if(!nodeHasAnyBefore(node) && isBoundary) {
            // A <group> first primary boundary is artificially added to FractionalUCA.txt.
            // It is reachable via its special contraction, but is not normally used.
            // Find the first character tailored after the boundary CE,
            // or the first real root CE after it.
            if((index = nextIndexFromNode(node)) != 0) {
                // If there is a following node, then it must be tailored
                // because there are no root CEs with a boundary primary
                // and non-common secondary/tertiary weights.
                node = nodes.elementAti(index);
                U_ASSERT(isTailoredNode(node));
                ce = tempCEFromIndexAndStrength(index, strength);
            } else {
                U_ASSERT(strength == UCOL_PRIMARY);
                uint32_t p = (uint32_t)(ce >> 32);
                int32_t pIndex = rootElements.findPrimary(p);
                UBool isCompressible = baseData->isCompressiblePrimary(p);
                p = rootElements.getPrimaryAfter(p, pIndex, isCompressible);
                ce = Collation::makeCE(p);
                index = findOrInsertNodeForRootCE(ce, UCOL_PRIMARY, errorCode);
                if(U_FAILURE(errorCode)) { return 0; }
                node = nodes.elementAti(index);
            }
        }
        if(nodeHasAnyBefore(node)) {
            // Get the first node that was tailored before this one at a weaker strength.
            if(nodeHasBefore2(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                node = nodes.elementAti(index);
            }
            if(nodeHasBefore3(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
            }
            U_ASSERT(isTailoredNode(nodes.elementAti(index)));
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    } else {
        // odd pos = [last xyz]
        // Find the last node that was tailored after the [last xyz]
        // at a strength no greater than the position's strength.
        for(;;) {
            int32_t nextIndex = nextIndexFromNode(node);
            if(nextIndex == 0) { break; }
            int64_t nextNode = nodes.elementAti(nextIndex);
            if(strengthFromNode(nextNode) < strength) { break; }
            index = nextIndex;
            node = nextNode;
        }
        // Do not make a temporary CE for a root node.
        // This last node might be the node for the root CE itself,
        // or a node with a common secondary or tertiary weight.
        if(isTailoredNode(node)) {
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    }
    return ce;
}